

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

int64_t __thiscall
aeron::archive::AeronArchive::awaitSessionOpened(AeronArchive *this,int64_t correlationId)

{
  Value __val;
  long lVar1;
  int64_t iVar2;
  ArchiveException *pAVar3;
  string *__rhs;
  char *pcVar4;
  allocator local_f2;
  allocator local_f1;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  deadline;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  deadline.__d.__r = (duration)(lVar1 + (this->messageTimeoutNs_).__r);
  awaitConnection(this,&deadline);
  do {
    pollNextResponse(this,correlationId,&deadline);
    iVar2 = ControlResponsePoller::correlationId
                      ((this->controlResponsePoller_)._M_t.
                       super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                       .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                       _M_head_impl);
    if (iVar2 == correlationId) {
      iVar2 = ControlResponsePoller::templateId
                        ((this->controlResponsePoller_)._M_t.
                         super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                         .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                         _M_head_impl);
      if (iVar2 == 1) {
        __val = ControlResponsePoller::code
                          ((this->controlResponsePoller_)._M_t.
                           super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                           .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                           _M_head_impl);
        if (__val == OK) {
          iVar2 = ControlResponsePoller::controlSessionId
                            ((this->controlResponsePoller_)._M_t.
                             super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                             .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                             _M_head_impl);
          return iVar2;
        }
        if (__val == ERROR) {
          pAVar3 = (ArchiveException *)__cxa_allocate_exception(0x48);
          __rhs = ControlResponsePoller::errorMessage_abi_cxx11_
                            ((this->controlResponsePoller_)._M_t.
                             super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                             .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                             _M_head_impl);
          std::operator+(&local_d0,"unexpected response: ",__rhs);
          std::operator+(&local_b0,&local_d0,", relevant id: ");
          iVar2 = ControlResponsePoller::relevantId
                            ((this->controlResponsePoller_)._M_t.
                             super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
                             .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>.
                             _M_head_impl);
          std::__cxx11::to_string(&local_f0,iVar2);
          std::operator+(&local_90,&local_b0,&local_f0);
          std::__cxx11::string::string
                    ((string *)&local_50,
                     "std::int64_t aeron::archive::AeronArchive::awaitSessionOpened(std::int64_t)",
                     &local_f1);
          pcVar4 = aeron::util::past_prefix
                             ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                             );
          std::__cxx11::string::string((string *)&local_70,pcVar4,&local_f2);
          ArchiveException::ArchiveException(pAVar3,&local_90,&local_50,&local_70,0x147);
          __cxa_throw(pAVar3,&ArchiveException::typeinfo,
                      aeron::util::SourcedException::~SourcedException);
        }
        pAVar3 = (ArchiveException *)__cxa_allocate_exception(0x48);
        std::__cxx11::to_string(&local_b0,__val);
        std::operator+(&local_90,"unexpected response: code=",&local_b0);
        std::__cxx11::string::string
                  ((string *)&local_d0,
                   "std::int64_t aeron::archive::AeronArchive::awaitSessionOpened(std::int64_t)",
                   (allocator *)&local_50);
        pcVar4 = aeron::util::past_prefix
                           ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp"
                           );
        std::__cxx11::string::string((string *)&local_f0,pcVar4,(allocator *)&local_70);
        ArchiveException::ArchiveException(pAVar3,&local_90,&local_d0,&local_f0,0x14a);
        __cxa_throw(pAVar3,&ArchiveException::typeinfo,
                    aeron::util::SourcedException::~SourcedException);
      }
    }
    concurrent::AgentInvoker<aeron::ClientConductor>::invoke
              (&((this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->m_conductorInvoker);
  } while( true );
}

Assistant:

std::int64_t AeronArchive::awaitSessionOpened(std::int64_t correlationId) {
    auto deadline = Clock::now() + messageTimeoutNs_;

    awaitConnection(deadline);

    while (true) {
        pollNextResponse(correlationId, deadline);

        if (controlResponsePoller_->correlationId() != correlationId ||
            controlResponsePoller_->templateId() != codecs::ControlResponse::sbeTemplateId()) {
            aeron_->conductorAgentInvoker().invoke();
            continue;
        }

        auto code = controlResponsePoller_->code();
        if (code != codecs::ControlResponseCode::OK) {
            if (code == codecs::ControlResponseCode::ERROR) {
                throw ArchiveException("unexpected response: " + controlResponsePoller_->errorMessage() +
                                           ", relevant id: " + std::to_string(controlResponsePoller_->relevantId()),
                                       SOURCEINFO);
            }

            throw ArchiveException("unexpected response: code=" + std::to_string(code), SOURCEINFO);
        }

        return controlResponsePoller_->controlSessionId();
    }
}